

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

size_t bitset_difference_count(bitset_t *b1,bitset_t *b2)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = b1->arraysize;
  uVar3 = b2->arraysize;
  if (uVar1 < b2->arraysize) {
    uVar3 = uVar1;
  }
  if (uVar3 == 0) {
    uVar3 = 0;
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    uVar4 = 0;
    do {
      uVar5 = ~b2->array[uVar4] & b1->array[uVar4];
      uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
      uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
      sVar2 = sVar2 + (((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  if (uVar3 < uVar1) {
    do {
      uVar4 = b1->array[uVar3] - (b1->array[uVar3] >> 1 & 0x5555555555555555);
      uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
      sVar2 = sVar2 + (((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  return sVar2;
}

Assistant:

size_t  bitset_difference_count(const bitset_t * CBITSET_RESTRICT b1, const bitset_t * CBITSET_RESTRICT b2) {
  size_t minlength = b1->arraysize < b2->arraysize ? b1->arraysize : b2->arraysize;
  size_t k = 0;
  size_t answer = 0;
  for( ; k < minlength; ++k) {
    answer += cbitset_hamming (b1->array[k] & ~ (b2->array[k]));
  }
  for( ; k < b1->arraysize ; ++k) {
    answer += cbitset_hamming (b1->array[k]);
  }
  return answer;
}